

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O0

int writeString(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json
               )

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  CURLcode CVar4;
  size_t sVar5;
  char *pcVar6;
  char *local_a0;
  char *ptr;
  size_t len;
  curl_slist *slist;
  _Bool error;
  httpmap *phStack_68;
  int i;
  httpmap *m;
  long version;
  dynbuf buf;
  char *freestr;
  char *strinfo;
  _Bool valid;
  _Bool use_json_local;
  per_transfer *ppStack_20;
  CURLcode per_result_local;
  per_transfer *per_local;
  writeoutvar *wovar_local;
  FILE *stream_local;
  
  strinfo._2_1_ = 0;
  freestr = (char *)0x0;
  buf.toobig = 0;
  strinfo._3_1_ = use_json;
  strinfo._4_4_ = per_result;
  ppStack_20 = per;
  per_local = (per_transfer *)wovar;
  wovar_local = (writeoutvar *)stream;
  curlx_dyn_init((dynbuf *)&version,0x40000);
  if (*(int *)((long)&per_local->prev + 4) == 0) {
    switch(*(undefined4 *)&per_local->prev) {
    case 2:
      certinfo(ppStack_20);
      if (ppStack_20->certinfo == (curl_certinfo *)0x0) {
        freestr = "";
      }
      else {
        bVar2 = false;
        slist._4_4_ = 0;
        while( true ) {
          bVar1 = false;
          if (slist._4_4_ < ppStack_20->certinfo->num_of_certs) {
            bVar1 = (bool)(bVar2 ^ 1);
          }
          if (!bVar1) break;
          for (len = (size_t)ppStack_20->certinfo->certinfo[slist._4_4_]; len != 0;
              len = *(size_t *)(len + 8)) {
            iVar3 = curl_strnequal(*(undefined8 *)len,"cert:",5);
            if (iVar3 == 0) {
              CVar4 = curlx_dyn_add((dynbuf *)&version,*(char **)len);
              if (CVar4 != CURLE_OK) {
                bVar2 = true;
                break;
              }
            }
            else {
              CVar4 = curlx_dyn_add((dynbuf *)&version,(char *)(*(long *)len + 5));
              if (CVar4 != CURLE_OK) {
                bVar2 = true;
                break;
              }
            }
            sVar5 = curlx_dyn_len((dynbuf *)&version);
            if (((sVar5 != 0) &&
                (pcVar6 = curlx_dyn_ptr((dynbuf *)&version), pcVar6[sVar5 - 1] != '\n')) &&
               (CVar4 = curlx_dyn_addn((dynbuf *)&version,"\n",1), CVar4 != CURLE_OK)) {
              bVar2 = true;
              break;
            }
          }
          slist._4_4_ = slist._4_4_ + 1;
        }
        if (!bVar2) {
          freestr = curlx_dyn_ptr((dynbuf *)&version);
          if (freestr == (char *)0x0) {
            freestr = "";
          }
          strinfo._2_1_ = 1;
        }
      }
      break;
    default:
      break;
    case 7:
      if ((ppStack_20->outs).filename != (char *)0x0) {
        freestr = (ppStack_20->outs).filename;
        strinfo._2_1_ = 1;
      }
      break;
    case 10:
      if (strinfo._4_4_ != CURLE_OK) {
        if ((ppStack_20->errorbuffer == (char *)0x0) || (*ppStack_20->errorbuffer == '\0')) {
          local_a0 = (char *)curl_easy_strerror(strinfo._4_4_);
        }
        else {
          local_a0 = ppStack_20->errorbuffer;
        }
        freestr = local_a0;
        strinfo._2_1_ = 1;
      }
      break;
    case 0x12:
      if (ppStack_20->url != (char *)0x0) {
        freestr = ppStack_20->url;
        strinfo._2_1_ = 1;
      }
      break;
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
      if ((ppStack_20->url != (char *)0x0) &&
         (iVar3 = urlpart(ppStack_20,*(writeoutid *)&per_local->prev,&freestr), iVar3 == 0)) {
        buf.toobig = (size_t)freestr;
        strinfo._2_1_ = 1;
      }
    }
  }
  else if (*(int *)((long)&per_local->prev + 4) == 0x20002e) {
    m = (httpmap *)0x0;
    iVar3 = curl_easy_getinfo(ppStack_20->curl,0x20002e,&m);
    if (iVar3 == 0) {
      for (phStack_68 = http_version; phStack_68->str != (char *)0x0; phStack_68 = phStack_68 + 1) {
        if ((httpmap *)(long)phStack_68->num == m) {
          freestr = phStack_68->str;
          strinfo._2_1_ = 1;
          break;
        }
      }
    }
  }
  else {
    iVar3 = curl_easy_getinfo(ppStack_20->curl,*(undefined4 *)((long)&per_local->prev + 4),&freestr)
    ;
    if ((iVar3 == 0) && (freestr != (char *)0x0)) {
      strinfo._2_1_ = 1;
    }
  }
  if (((strinfo._2_1_ & 1) == 0) || (freestr == (char *)0x0)) {
    if ((strinfo._3_1_ & 1) != 0) {
      curl_mfprintf(wovar_local,"\"%s\":null",per_local->next);
    }
  }
  else if ((strinfo._3_1_ & 1) == 0) {
    fputs(freestr,(FILE *)wovar_local);
  }
  else {
    curl_mfprintf(wovar_local,"\"%s\":",per_local->next);
    jsonWriteString((FILE *)wovar_local,freestr,false);
  }
  curl_free(buf.toobig);
  curlx_dyn_free((dynbuf *)&version);
  return 1;
}

Assistant:

static int writeString(FILE *stream, const struct writeoutvar *wovar,
                       struct per_transfer *per, CURLcode per_result,
                       bool use_json)
{
  bool valid = false;
  const char *strinfo = NULL;
  const char *freestr = NULL;
  struct dynbuf buf;
  curlx_dyn_init(&buf, 256*1024);

  DEBUGASSERT(wovar->writefunc == writeString);

  if(wovar->ci) {
    if(wovar->ci == CURLINFO_HTTP_VERSION) {
      long version = 0;
      if(!curl_easy_getinfo(per->curl, CURLINFO_HTTP_VERSION, &version)) {
        const struct httpmap *m = &http_version[0];
        while(m->str) {
          if(m->num == version) {
            strinfo = m->str;
            valid = true;
            break;
          }
          m++;
        }
      }
    }
    else {
      if(!curl_easy_getinfo(per->curl, wovar->ci, &strinfo) && strinfo)
        valid = true;
    }
  }
  else {
    switch(wovar->id) {
    case VAR_CERT:
      certinfo(per);
      if(per->certinfo) {
        int i;
        bool error = FALSE;
        for(i = 0; (i < per->certinfo->num_of_certs) && !error; i++) {
          struct curl_slist *slist;

          for(slist = per->certinfo->certinfo[i]; slist; slist = slist->next) {
            size_t len;
            if(curl_strnequal(slist->data, "cert:", 5)) {
              if(curlx_dyn_add(&buf, &slist->data[5])) {
                error = TRUE;
                break;
              }
            }
            else {
              if(curlx_dyn_add(&buf, slist->data)) {
                error = TRUE;
                break;
              }
            }
            len = curlx_dyn_len(&buf);
            if(len) {
              char *ptr = curlx_dyn_ptr(&buf);
              if(ptr[len -1] != '\n') {
                /* add a newline to make things look better */
                if(curlx_dyn_addn(&buf, "\n", 1)) {
                  error = TRUE;
                  break;
                }
              }
            }
          }
        }
        if(!error) {
          strinfo = curlx_dyn_ptr(&buf);
          if(!strinfo)
            /* maybe not a TLS protocol */
            strinfo = "";
          valid = true;
        }
      }
      else
        strinfo = ""; /* no cert info */
      break;
    case VAR_ERRORMSG:
      if(per_result) {
        strinfo = (per->errorbuffer && per->errorbuffer[0]) ?
          per->errorbuffer : curl_easy_strerror(per_result);
        valid = true;
      }
      break;
    case VAR_EFFECTIVE_FILENAME:
      if(per->outs.filename) {
        strinfo = per->outs.filename;
        valid = true;
      }
      break;
    case VAR_INPUT_URL:
      if(per->url) {
        strinfo = per->url;
        valid = true;
      }
      break;
    case VAR_INPUT_URLSCHEME:
    case VAR_INPUT_URLUSER:
    case VAR_INPUT_URLPASSWORD:
    case VAR_INPUT_URLOPTIONS:
    case VAR_INPUT_URLHOST:
    case VAR_INPUT_URLPORT:
    case VAR_INPUT_URLPATH:
    case VAR_INPUT_URLQUERY:
    case VAR_INPUT_URLFRAGMENT:
    case VAR_INPUT_URLZONEID:
    case VAR_INPUT_URLESCHEME:
    case VAR_INPUT_URLEUSER:
    case VAR_INPUT_URLEPASSWORD:
    case VAR_INPUT_URLEOPTIONS:
    case VAR_INPUT_URLEHOST:
    case VAR_INPUT_URLEPORT:
    case VAR_INPUT_URLEPATH:
    case VAR_INPUT_URLEQUERY:
    case VAR_INPUT_URLEFRAGMENT:
    case VAR_INPUT_URLEZONEID:
      if(per->url) {
        if(!urlpart(per, wovar->id, &strinfo)) {
          freestr = strinfo;
          valid = true;
        }
      }
      break;
    default:
      DEBUGASSERT(0);
      break;
    }
  }

  DEBUGASSERT(!valid || strinfo);
  if(valid && strinfo) {
    if(use_json) {
      fprintf(stream, "\"%s\":", wovar->name);
      jsonWriteString(stream, strinfo, FALSE);
    }
    else
      fputs(strinfo, stream);
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }
  curl_free((char *)CURL_UNCONST(freestr));

  curlx_dyn_free(&buf);
  return 1; /* return 1 if anything was written */
}